

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.h
# Opt level: O3

bool __thiscall
vo::OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
          (OpticalFlowPatch<float,_vo::Pattern51<float>_> *this,Image<const_unsigned_short> *img,
          Matrix2P *transformed_pattern,VectorP *residual)

{
  size_t sVar1;
  unsigned_short *puVar2;
  size_t sVar3;
  size_t sVar4;
  int i_1;
  bool bVar5;
  long lVar6;
  int iVar7;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  
  sVar3 = img->w;
  sVar4 = img->h;
  sVar1 = img->pitch;
  puVar2 = img->ptr;
  fVar11 = 0.0;
  lVar8 = 0;
  iVar7 = 0;
  do {
    fVar13 = (transformed_pattern->super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>).
             m_storage.m_data.array[lVar8 * 2];
    if ((((fVar13 < 2.0) || ((float)(int)sVar3 + -2.0 + -1.0 <= fVar13)) ||
        (fVar14 = (transformed_pattern->
                  super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>).m_storage.m_data.
                  array[lVar8 * 2 + 1], fVar14 < 2.0)) ||
       ((float)(int)sVar4 + -2.0 + -1.0 <= fVar14)) {
      (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
      array[lVar8] = -1.0;
    }
    else {
      iVar15 = (int)fVar14;
      fVar12 = fVar13 - (float)(int)fVar13;
      fVar14 = fVar14 - (float)iVar15;
      lVar9 = (long)(int)fVar13;
      lVar6 = sVar1 * (long)iVar15;
      lVar10 = (long)(iVar15 + 1) * sVar1;
      fVar13 = (float)*(ushort *)((long)puVar2 + lVar9 * 2 + lVar10 + 2) * fVar14 * fVar12 +
               (float)*(ushort *)((long)puVar2 + lVar9 * 2 + lVar6 + 2) * (1.0 - fVar14) * fVar12 +
               (float)*(ushort *)((long)puVar2 + lVar9 * 2 + lVar10) * (1.0 - fVar12) * fVar14 +
               (float)*(ushort *)((long)puVar2 + lVar9 * 2 + lVar6) *
               (1.0 - fVar12) * (1.0 - fVar14);
      (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
      array[lVar8] = fVar13;
      fVar11 = fVar11 + fVar13;
      iVar7 = iVar7 + 1;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x34);
  if (1.1920929e-07 <= fVar11) {
    lVar8 = 0;
    iVar15 = 0;
    do {
      fVar13 = (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.
               m_data.array[lVar8];
      if ((fVar13 < 0.0) ||
         (fVar14 = (this->data).super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.
                   m_storage.m_data.array[lVar8], fVar14 < 0.0)) {
        (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
        array[lVar8] = 0.0;
      }
      else {
        (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
        array[lVar8] = (fVar13 * (float)iVar7) / fVar11 - fVar14;
        iVar15 = iVar15 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x34);
    bVar5 = 0x1a < iVar15;
  }
  else {
    bVar5 = false;
    memset(residual,0,0xd0);
  }
  return bVar5;
}

Assistant:

inline bool residual(const Image<const uint16_t> &img,
                       const Matrix2P &transformed_pattern,
                       VectorP &residual) const {
    Scalar sum = 0;
    int num_valid_points = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (img.InBounds(transformed_pattern.col(i), 2)) {
        residual[i] = img.interp<Scalar>(transformed_pattern.col(i));
        sum += residual[i];
        num_valid_points++;
      } else {
        residual[i] = -1;
      }
    }

    // all-black patch cannot be normalized
    if (sum < std::numeric_limits<Scalar>::epsilon()) {
      residual.setZero();
      return false;
    }

    int num_residuals = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (residual[i] >= 0 && data[i] >= 0) {
        const Scalar val = residual[i];
        residual[i] = num_valid_points * val / sum - data[i];
        num_residuals++;

      } else {
        residual[i] = 0;
      }
    }

    return num_residuals > PATTERN_SIZE / 2;
  }